

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void main_reestimate(model_inventory_t *inv,lexicon_t *lex,model_def_t *mdef,feat_t *feat,
                    int32 viterbi)

{
  int iVar1;
  int32 iVar2;
  cmd_ln_t *pcVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  double dVar9;
  double local_248;
  double local_238;
  double local_230;
  double local_218;
  double local_200;
  char *local_1e0;
  char *local_1d8;
  undefined4 local_1cc;
  char local_1c8 [8];
  char time_str_1 [64];
  undefined8 local_180;
  time_t t_1;
  char time_str [64];
  time_t local_130;
  time_t t;
  char *uttid;
  char *pdumpfn;
  uint local_110;
  uint32 outputfullpath;
  uint32 no_retries;
  uint32 ckpt_intv;
  uint32 n_frame_skipped;
  uint32 maxuttlen;
  s3phseg_t *phseg;
  uint32 n_utt;
  int32 var_is_full;
  int32 pass2var;
  int32 profile;
  bw_timers_t *timers;
  FILE *pFStack_d8;
  uint32 in_veclen;
  FILE *pdumpfh;
  char *pdumpdir;
  char *trans;
  uint32 var_reest;
  uint32 mean_reest;
  uint32 tmat_reest;
  uint32 mixw_reest;
  uint32 seq_no;
  float32 spthresh;
  float64 b_beam;
  float64 a_beam;
  double dStack_90;
  uint32 total_frames;
  float64 log_lik;
  float64 total_log_lik;
  state_t *psStack_78;
  uint32 n_state;
  state_t *state_seq;
  vector_t **f;
  uint32 svd_n_frame;
  int32 n_frame;
  vector_t *mfcc;
  feat_t *pfStack_50;
  int32 viterbi_local;
  feat_t *feat_local;
  model_def_t *mdef_local;
  lexicon_t *lex_local;
  model_inventory_t *inv_local;
  
  total_log_lik._4_4_ = 0;
  _pass2var = (bw_timers_t *)0x0;
  _n_frame_skipped = (s3phseg_t *)0x0;
  no_retries = 0;
  outputfullpath = 0;
  local_110 = 0;
  pdumpfn._4_4_ = 0;
  pcVar7 = "Baum-Welch";
  if (viterbi != 0) {
    pcVar7 = "Viterbi";
  }
  mfcc._4_4_ = viterbi;
  pfStack_50 = feat;
  feat_local = (feat_t *)mdef;
  mdef_local = (model_def_t *)lex;
  lex_local = (lexicon_t *)inv;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
          ,0x27d,"Reestimation: %s\n",pcVar7);
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-timing");
  var_is_full = (int32)lVar4;
  if (var_is_full != 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x281,"Generating profiling information consumes significant CPU resources.\n");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x282,"If you are not interested in profiling, use -timing no\n");
  }
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-outputfullpath");
  pdumpfn._4_4_ = (int)lVar4;
  if (var_is_full != 0) {
    _pass2var = (bw_timers_t *)
                __ckd_calloc__(1,0x1c0,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                               ,0x287);
    ptmr_init((ptmr_t *)_pass2var);
    ptmr_init(&_pass2var->upd_timer);
    ptmr_init(&_pass2var->fwd_timer);
    ptmr_init(&_pass2var->bwd_timer);
    ptmr_init(&_pass2var->gau_timer);
    ptmr_init(&_pass2var->rsts_timer);
    ptmr_init(&_pass2var->rstf_timer);
    ptmr_init(&_pass2var->rstu_timer);
  }
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-mixwreest");
  mean_reest = (uint32)lVar4;
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-tmatreest");
  var_reest = (uint32)lVar4;
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-meanreest");
  trans._4_4_ = (int)lVar4;
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-varreest");
  trans._0_4_ = (int)lVar4;
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-2passvar");
  n_utt = (uint32)lVar4;
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-fullvar");
  phseg._4_4_ = (int32)lVar4;
  pcVar3 = cmd_ln_get();
  pdumpfh = (FILE *)cmd_ln_str_r(pcVar3,"-pdumpdir");
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-ceplen");
  timers._4_4_ = (uint32)lVar4;
  pcVar3 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar3,"-ckptintv");
  if (pcVar7 != (char *)0x0) {
    pcVar3 = cmd_ln_get();
    lVar4 = cmd_ln_int_r(pcVar3,"-ckptintv");
    outputfullpath = (uint32)lVar4;
  }
  pcVar3 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar3,"-accumdir");
  if (pcVar7 == (char *)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x2a0,"NO ACCUMDIR SET.  No counts will be written; assuming debug\n");
  }
  if ((((mean_reest == 0) && (var_reest == 0)) && (trans._4_4_ == 0)) && ((int)trans == 0)) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x2a4,"No reestimation specified!  None done.\n");
  }
  else {
    log_lik = 0.0;
    a_beam._4_4_ = 0;
    pcVar3 = cmd_ln_get();
    b_beam = (float64)cmd_ln_float_r(pcVar3,"-abeam");
    pcVar3 = cmd_ln_get();
    _seq_no = cmd_ln_float_r(pcVar3,"-bbeam");
    pcVar3 = cmd_ln_get();
    dVar9 = cmd_ln_float_r(pcVar3,"-spthresh");
    mixw_reest = (uint32)(float)dVar9;
    pcVar3 = cmd_ln_get();
    lVar4 = cmd_ln_int_r(pcVar3,"-maxuttlen");
    ckpt_intv = (uint32)lVar4;
    tmat_reest = corpus_get_begin();
    printf("column defns\n");
    printf("\t<seq>\n");
    printf("\t<id>\n");
    printf("\t<n_frame_in>\n");
    printf("\t<n_frame_del>\n");
    printf("\t<n_state_shmm>\n");
    printf("\t<avg_states_alpha>\n");
    pcVar3 = cmd_ln_get();
    lVar4 = cmd_ln_int_r(pcVar3,"-viterbi");
    if ((int)lVar4 == 0) {
      printf("\t<avg_states_beta>\n");
      printf("\t<avg_states_reest>\n");
      printf("\t<avg_posterior_prune>\n");
    }
    printf("\t<frame_log_lik>\n");
    printf("\t<utt_log_lik>\n");
    printf("\t... timing info ... \n");
    phseg._0_4_ = 0;
    while (iVar1 = corpus_next_utt(), iVar1 != 0) {
      if (_pass2var != (bw_timers_t *)0x0) {
        ptmr_reset(&_pass2var->utt_timer);
        ptmr_reset(&_pass2var->upd_timer);
        ptmr_reset(&_pass2var->fwd_timer);
        ptmr_reset(&_pass2var->bwd_timer);
        ptmr_reset(&_pass2var->gau_timer);
        ptmr_reset(&_pass2var->rsts_timer);
        ptmr_reset(&_pass2var->rstf_timer);
        ptmr_reset(&_pass2var->rstu_timer);
      }
      if (_pass2var != (bw_timers_t *)0x0) {
        ptmr_start(&_pass2var->utt_timer);
      }
      local_1cc = tmat_reest;
      if (pdumpfn._4_4_ == 0) {
        local_1d8 = corpus_utt();
      }
      else {
        local_1d8 = corpus_utt_full_name();
      }
      printf("utt> %5u %25s",(ulong)local_1cc,local_1d8);
      iVar1 = corpus_get_generic_featurevec
                        ((vector_t **)&svd_n_frame,(int32 *)((long)&f + 4),timers._4_4_);
      if (iVar1 < 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x2de,"Can\'t read input features\n");
        exit(1);
      }
      printf(" %4u",(ulong)f._4_4_);
      if ((int)f._4_4_ < 9) {
        pcVar7 = corpus_utt();
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x2e4,"utt %s too short\n",pcVar7);
        if (_svd_n_frame != (mfcc_t **)0x0) {
          ckd_free(*_svd_n_frame);
          ckd_free(_svd_n_frame);
        }
      }
      else if ((ckpt_intv == 0) || (f._4_4_ <= ckpt_intv)) {
        f._0_4_ = f._4_4_;
        state_seq = (state_t *)feat_array_alloc(pfStack_50,f._4_4_ + pfStack_50->window_size);
        feat_s2mfc2feat_live
                  (pfStack_50,_svd_n_frame,(int32 *)((long)&f + 4),1,1,(mfcc_t ***)state_seq);
        printf(" %4u",(ulong)(f._4_4_ - (uint)f));
        corpus_get_sent(&pdumpdir);
        corpus_get_phseg((acmod_set_t *)lex_local->ht,(s3phseg_t **)&n_frame_skipped);
        if (pdumpfh == (FILE *)0x0) {
          pFStack_d8 = (FILE *)0x0;
        }
        else {
          if (pdumpfn._4_4_ == 0) {
            local_1e0 = corpus_utt();
          }
          else {
            local_1e0 = corpus_utt_full_name();
          }
          t = (time_t)local_1e0;
          sVar5 = strlen((char *)pdumpfh);
          sVar6 = strlen((char *)t);
          uttid = (char *)__ckd_calloc__(sVar5 + sVar6 + 8,1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                         ,0x30b);
          strcpy(uttid,(char *)pdumpfh);
          strcat(uttid,"/");
          strcat(uttid,(char *)t);
          strcat(uttid,".pdump");
          pFStack_d8 = fopen(uttid,"w");
          if (pFStack_d8 == (FILE *)0x0) {
            err_msg_system(ERR_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                           ,0x311,"Failed to open %s for writing",uttid);
            exit(1);
          }
          ckd_free(uttid);
        }
        if (_pass2var != (bw_timers_t *)0x0) {
          ptmr_start(&_pass2var->upd_timer);
        }
        psStack_78 = next_utt_states((uint32 *)((long)&total_log_lik + 4),(lexicon_t *)mdef_local,
                                     (model_inventory_t *)lex_local,(model_def_t *)feat_local,
                                     pdumpdir);
        printf(" %5u",(ulong)total_log_lik._4_4_);
        if (psStack_78 == (state_t *)0x0) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                  ,0x31e,"Skipped utterance \'%s\'\n",pdumpdir);
        }
        else if (mfcc._4_4_ == 0) {
          iVar2 = baum_welch_update((float64 *)&stack0xffffffffffffff70,(vector_t **)state_seq,
                                    f._4_4_,psStack_78,total_log_lik._4_4_,
                                    (model_inventory_t *)lex_local,b_beam,(float64)_seq_no,
                                    (float32)mixw_reest,_n_frame_skipped,mean_reest,var_reest,
                                    trans._4_4_,(int)trans,n_utt,phseg._4_4_,(FILE *)pFStack_d8,
                                    _pass2var,pfStack_50);
          if (iVar2 == 0) {
            a_beam._4_4_ = f._4_4_ + a_beam._4_4_;
            log_lik = (float64)(dStack_90 + (double)log_lik);
            if ((int)f._4_4_ < 1) {
              local_200 = 0.0;
            }
            else {
              local_200 = dStack_90 / (double)(int)f._4_4_;
            }
            printf(" %e %e",local_200,dStack_90);
          }
        }
        else {
          iVar2 = viterbi_update((float64 *)&stack0xffffffffffffff70,(vector_t **)state_seq,f._4_4_,
                                 psStack_78,total_log_lik._4_4_,(model_inventory_t *)lex_local,
                                 b_beam,(float32)mixw_reest,_n_frame_skipped,mean_reest,var_reest,
                                 trans._4_4_,(int)trans,n_utt,phseg._4_4_,(FILE *)pFStack_d8,
                                 _pass2var,pfStack_50);
          if (iVar2 == 0) {
            a_beam._4_4_ = f._4_4_ + a_beam._4_4_;
            log_lik = (float64)(dStack_90 + (double)log_lik);
            if ((int)f._4_4_ < 1) {
              local_218 = 0.0;
            }
            else {
              local_218 = dStack_90 / (double)(int)f._4_4_;
            }
            printf(" %e %e",local_218,dStack_90);
          }
        }
        if (_pass2var != (bw_timers_t *)0x0) {
          ptmr_stop(&_pass2var->upd_timer);
        }
        if (pFStack_d8 != (FILE *)0x0) {
          fclose(pFStack_d8);
        }
        free(*_svd_n_frame);
        ckd_free(_svd_n_frame);
        feat_array_free((mfcc_t ***)state_seq);
        free(pdumpdir);
        tmat_reest = tmat_reest + 1;
        phseg._0_4_ = (uint)phseg + 1;
        if (_pass2var != (bw_timers_t *)0x0) {
          ptmr_stop(&_pass2var->utt_timer);
        }
        if (var_is_full != 0) {
          print_all_timers(_pass2var,f._4_4_);
        }
        printf("\n");
        fflush(_stdout);
        if ((outputfullpath != 0) && ((uint)phseg % outputfullpath == 0)) {
          pcVar3 = cmd_ln_get();
          pcVar7 = cmd_ln_str_r(pcVar3,"-accumdir");
          if (pcVar7 != (char *)0x0) {
            while( true ) {
              pcVar3 = cmd_ln_get();
              pcVar7 = cmd_ln_str_r(pcVar3,"-accumdir");
              iVar2 = accum_dump(pcVar7,(model_inventory_t *)lex_local,mean_reest,var_reest,
                                 trans._4_4_,(int)trans,n_utt,phseg._4_4_,1);
              if (iVar2 == 0) break;
              if (main_reestimate::notified == 0) {
                local_130 = time((time_t *)0x0);
                pcVar7 = ctime(&local_130);
                strcpy((char *)&t_1,pcVar7);
                sVar5 = strlen((char *)&t_1);
                *(undefined1 *)((long)&local_180 + sVar5 + 7) = 0;
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                        ,900,
                        "Ckpt count dump failed on %s.  Retrying dump every %3.1f hour until success.\n"
                        ,0x3f4b4e81b4e81b4f,&t_1);
                main_reestimate::notified = 1;
                local_110 = local_110 + 1;
                if (10 < local_110) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                          ,0x389,"Failed to get the files after 10 retries(about 5 minutes).\n ");
                  exit(1);
                }
              }
              sleep(3);
            }
          }
        }
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x2ed,"utt # frames > -maxuttlen; skipping\n");
        no_retries = f._4_4_ + no_retries;
        if (_svd_n_frame != (mfcc_t **)0x0) {
          ckd_free(*_svd_n_frame);
          ckd_free(_svd_n_frame);
        }
      }
    }
    if (a_beam._4_4_ == 0) {
      local_230 = 0.0;
    }
    else {
      local_230 = (double)log_lik / (double)a_beam._4_4_;
    }
    printf("overall> stats %u (-%u) %e %e",local_230,(ulong)a_beam._4_4_,(ulong)no_retries);
    if (var_is_full != 0) {
      if (a_beam._4_4_ == 0) {
        local_238 = 0.0;
      }
      else {
        local_238 = (double)(_pass2var->utt_timer).t_tot_cpu / ((double)a_beam._4_4_ * 0.01);
      }
      if ((double)(_pass2var->utt_timer).t_tot_cpu <= 0.0) {
        local_248 = 0.0;
      }
      else {
        local_248 = (double)(_pass2var->utt_timer).t_tot_elapsed /
                    (double)(_pass2var->utt_timer).t_tot_cpu;
      }
      printf(" %4.3fx %4.3fe",local_238,local_248);
    }
    printf("\n");
    fflush(_stdout);
    local_110 = 0;
    while( true ) {
      pcVar3 = cmd_ln_get();
      pcVar7 = cmd_ln_str_r(pcVar3,"-accumdir");
      bVar8 = false;
      if (pcVar7 != (char *)0x0) {
        pcVar3 = cmd_ln_get();
        pcVar7 = cmd_ln_str_r(pcVar3,"-accumdir");
        iVar2 = accum_dump(pcVar7,(model_inventory_t *)lex_local,mean_reest,var_reest,trans._4_4_,
                           (int)trans,n_utt,phseg._4_4_,0);
        bVar8 = iVar2 != 0;
      }
      if (!bVar8) break;
      if (main_reestimate::notified_1 == 0) {
        local_180 = time((time_t *)0x0);
        pcVar7 = ctime(&local_180);
        strcpy(local_1c8,pcVar7);
        sVar5 = strlen(local_1c8);
        local_1c8[sVar5 - 1] = '\0';
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x3b7,"Count dump failed on %s.  Retrying dump every %3.1f hour until success.\n",
                0x3f4b4e81b4e81b4f,local_1c8);
        main_reestimate::notified_1 = 1;
        local_110 = local_110 + 1;
        if (10 < local_110) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                  ,0x3bc,"Failed to get the files after 10 retries(about 5 minutes).\n ");
          exit(1);
        }
      }
      sleep(3);
    }
    if (var_is_full != 0) {
      ckd_free(_pass2var);
    }
    pcVar3 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar3,"-accumdir");
    if (pcVar7 == (char *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x3cd,"Counts NOT saved.\n");
    }
    else {
      pcVar3 = cmd_ln_get();
      pcVar7 = cmd_ln_str_r(pcVar3,"-accumdir");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x3cb,"Counts saved to %s\n",pcVar7);
    }
  }
  return;
}

Assistant:

void
main_reestimate(model_inventory_t *inv,
		lexicon_t *lex,
		model_def_t *mdef,
		feat_t *feat,
		int32 viterbi)
{
    vector_t *mfcc;	/* utterance cepstra */	
    int32 n_frame;	/* # of cepstrum frames  */
    uint32 svd_n_frame;	/* # of cepstrum frames  */
    vector_t **f;		/* independent feature streams derived
				 * from cepstra */
    state_t *state_seq;		/* sentence HMM state sequence for the
				   utterance */
    uint32 n_state = 0;	/* # of sentence HMM states */
    float64 total_log_lik;	/* total log liklihood over corpus */
    float64 log_lik;		/* log liklihood for an utterance */
    uint32 total_frames;	/* # of frames over the corpus */
    float64 a_beam;		/* alpha pruning beam */
    float64 b_beam;		/* beta pruning beam */
    float32 spthresh;		/* state posterior probability threshold */
    uint32 seq_no;	/* sequence # of utterance in corpus */
    uint32 mixw_reest;	/* if TRUE, reestimate mixing weights */
    uint32 tmat_reest;	/* if TRUE, reestimate transition probability matrices */
    uint32 mean_reest;	/* if TRUE, reestimate means */
    uint32 var_reest;	/* if TRUE, reestimate variances */
    char *trans;
    const char *pdumpdir;
    FILE *pdumpfh;
    uint32 in_veclen;

    bw_timers_t* timers = NULL;
    int32 profile;

    int32 pass2var;
    int32 var_is_full;

    uint32 n_utt;

    s3phseg_t *phseg = NULL;

    uint32 maxuttlen;
    uint32 n_frame_skipped = 0;

    uint32 ckpt_intv = 0;
    uint32 no_retries = 0;

    uint32 outputfullpath = 0;

    E_INFO("Reestimation: %s\n",
	(viterbi ? "Viterbi" : "Baum-Welch"));

    profile = cmd_ln_int32("-timing");
    if (profile) {
	E_INFO("Generating profiling information consumes significant CPU resources.\n");
	E_INFO("If you are not interested in profiling, use -timing no\n");
    }
    outputfullpath = cmd_ln_int32("-outputfullpath");

    if (profile) {
	timers = ckd_calloc(1, sizeof(bw_timers_t));
	ptmr_init(&timers->utt_timer);
	ptmr_init(&timers->upd_timer);
	ptmr_init(&timers->fwd_timer);
	ptmr_init(&timers->bwd_timer);
	ptmr_init(&timers->gau_timer);
	ptmr_init(&timers->rsts_timer);
	ptmr_init(&timers->rstf_timer);
	ptmr_init(&timers->rstu_timer);
    }

    mixw_reest = cmd_ln_int32("-mixwreest");
    tmat_reest = cmd_ln_int32("-tmatreest");
    mean_reest = cmd_ln_int32("-meanreest");
    var_reest = cmd_ln_int32("-varreest");
    pass2var = cmd_ln_int32("-2passvar");
    var_is_full = cmd_ln_int32("-fullvar");
    pdumpdir = cmd_ln_str("-pdumpdir");
    in_veclen = cmd_ln_int32("-ceplen");

    if (cmd_ln_str("-ckptintv")) {
	ckpt_intv = cmd_ln_int32("-ckptintv");
    }

    if (cmd_ln_str("-accumdir") == NULL) {
	E_WARN("NO ACCUMDIR SET.  No counts will be written; assuming debug\n");
    }

    if (!mixw_reest && !tmat_reest && !mean_reest && !var_reest) {
	E_WARN("No reestimation specified!  None done.\n");
	
	return;
    }

    total_log_lik = 0;
    total_frames = 0;

    a_beam = cmd_ln_float64("-abeam");
    b_beam = cmd_ln_float64("-bbeam");
    spthresh = cmd_ln_float32("-spthresh");
    maxuttlen = cmd_ln_int32("-maxuttlen");

    /* Begin by skipping over some (possibly zero) # of utterances.
     * Continue to process utterances until there are no more (either EOF
     * or end of run). */

    seq_no = corpus_get_begin();

    printf("column defns\n");
    printf("\t<seq>\n");
    printf("\t<id>\n");
    printf("\t<n_frame_in>\n");
    printf("\t<n_frame_del>\n");
    printf("\t<n_state_shmm>\n");
    printf("\t<avg_states_alpha>\n");
    if (!cmd_ln_int32("-viterbi")) {
	printf("\t<avg_states_beta>\n");
	printf("\t<avg_states_reest>\n");
	printf("\t<avg_posterior_prune>\n");
    }
    printf("\t<frame_log_lik>\n");
    printf("\t<utt_log_lik>\n");
    printf("\t... timing info ... \n");

    n_utt = 0;

    while (corpus_next_utt()) {
	/* Zero timers before utt processing begins */
	if (timers) {
	    ptmr_reset(&timers->utt_timer);
	    ptmr_reset(&timers->upd_timer);
	    ptmr_reset(&timers->fwd_timer);
	    ptmr_reset(&timers->bwd_timer);
	    ptmr_reset(&timers->gau_timer);
	    ptmr_reset(&timers->rsts_timer);
	    ptmr_reset(&timers->rstf_timer);
	    ptmr_reset(&timers->rstu_timer);
	}
	
	if (timers)
	    ptmr_start(&timers->utt_timer);

	printf("utt> %5u %25s", 
	       seq_no,
	       (outputfullpath ? corpus_utt_full_name() : corpus_utt()));

        if (corpus_get_generic_featurevec(&mfcc, &n_frame, in_veclen) < 0) {
	        E_FATAL("Can't read input features\n");
	}

	printf(" %4u", n_frame);

	if (n_frame < 9) {
	    E_WARN("utt %s too short\n", corpus_utt());
	    if (mfcc) {
		ckd_free(mfcc[0]);
		ckd_free(mfcc);
	    }
	    continue;
	}

	if ((maxuttlen > 0) && (n_frame > maxuttlen)) {
	    E_INFO("utt # frames > -maxuttlen; skipping\n");
	    n_frame_skipped += n_frame;
	    if (mfcc) {
		ckd_free(mfcc[0]);
		ckd_free(mfcc);
	    }

	    continue;
	}

	svd_n_frame = n_frame;

	f = feat_array_alloc(feat, n_frame + feat_window_size(feat));
	feat_s2mfc2feat_live(feat, mfcc, &n_frame, TRUE, TRUE, f);

	printf(" %4u", n_frame - svd_n_frame);

	/* Get the transcript */
	corpus_get_sent(&trans);

	/* Get the phone segmentation */
	corpus_get_phseg(inv->acmod_set, &phseg);

	/* Open a dump file if required. */
	if (pdumpdir) {
		char *pdumpfn, *uttid;

		uttid = (outputfullpath ? corpus_utt_full_name() : corpus_utt());
		pdumpfn = ckd_calloc(strlen(pdumpdir) + 1
				     + strlen(uttid)
				     + strlen(".pdump") + 1, 1);
		strcpy(pdumpfn, pdumpdir);
		strcat(pdumpfn, "/");
		strcat(pdumpfn, uttid);
		strcat(pdumpfn, ".pdump");
		if ((pdumpfh = fopen(pdumpfn, "w")) == NULL)
			E_FATAL_SYSTEM("Failed to open %s for writing", pdumpfn);
		ckd_free(pdumpfn);
	}
	else
		pdumpfh = NULL;

        if (timers)
	    ptmr_start(&timers->upd_timer);
	/* create a sentence HMM */
	state_seq = next_utt_states(&n_state, lex, inv, mdef, trans);
	printf(" %5u", n_state);
	
	if (state_seq == NULL) {
	    E_WARN("Skipped utterance '%s'\n", trans);
	} else if (!viterbi) {
	    /* accumulate reestimation sums for the utterance */
	    if (baum_welch_update(&log_lik,
				  f, n_frame,
				  state_seq, n_state,
				  inv,
				  a_beam,
				  b_beam,
				  spthresh,
				  phseg,
				  mixw_reest,
				  tmat_reest,
				  mean_reest,
				  var_reest,
				  pass2var,
				  var_is_full,
				  pdumpfh,
				  timers,
				  feat) == S3_SUCCESS) {
		total_frames += n_frame;
		total_log_lik += log_lik;
		
		printf(" %e %e",
		       (n_frame > 0 ? log_lik / n_frame : 0.0),
		       log_lik);
	    }

	} else {
	    /* Viterbi search and accumulate in it */
	    if (viterbi_update(&log_lik,
			       f, n_frame,
			       state_seq, n_state,
			       inv,
			       a_beam,
			       spthresh,
			       phseg,
			       mixw_reest,
			       tmat_reest,
			       mean_reest,
			       var_reest,
			       pass2var,
			       var_is_full,
			       pdumpfh, 
			       timers,
			       feat) == S3_SUCCESS) {
		total_frames += n_frame;
		total_log_lik += log_lik;
		printf(" %e %e",
		       (n_frame > 0 ? log_lik / n_frame : 0.0),
		       log_lik);
	    }
	}

	if (timers)
	    ptmr_stop(&timers->upd_timer);

	if (pdumpfh)
		fclose(pdumpfh);
	free(mfcc[0]);
	ckd_free(mfcc);
	feat_array_free(f);
	free(trans);	/* alloc'ed using strdup() */

	seq_no++;
	n_utt++;

        if (timers)
	    ptmr_stop(&timers->utt_timer);
    
	if (profile)
	    print_all_timers(timers, n_frame);

	printf("\n");
	fflush(stdout);

	if ((ckpt_intv > 0) &&
	    ((n_utt % ckpt_intv) == 0) &&
	    (cmd_ln_str("-accumdir") != NULL)) {
	    while (accum_dump(cmd_ln_str("-accumdir"),
			      inv,
			      mixw_reest,
			      tmat_reest,
			      mean_reest,
			      var_reest,
			      pass2var,
			      var_is_full,
			      TRUE) != S3_SUCCESS) {
		static int notified = FALSE;
		time_t t;
		char time_str[64];
		
		/*
		 * If we were not able to dump the parameters, write one log entry
		 * about the failure
		 */
		if (notified == FALSE) {
		    t = time(NULL);
		    strcpy(time_str, (const char *)ctime((const time_t *)&t));
		    /* nuke the newline at the end of this. */
		    time_str[strlen(time_str)-1] = '\0';
		    E_WARN("Ckpt count dump failed on %s.  Retrying dump every %3.1f hour until success.\n",
			   time_str, DUMP_RETRY_PERIOD/3600.0);
		    
		    notified = TRUE;
		    no_retries++;
		    if(no_retries>10){ 
		      E_FATAL("Failed to get the files after 10 retries(about 5 minutes).\n ");
		    }
		}
		sleep(DUMP_RETRY_PERIOD);
	    }
	}
    }

    printf("overall> stats %u (-%u) %e %e",
	   total_frames,
	   n_frame_skipped,
	   (total_frames > 0 ? total_log_lik / total_frames : 0.0),
	   total_log_lik);
    if (profile) {
	printf(" %4.3fx %4.3fe",
	       (total_frames > 0 ? timers->utt_timer.t_tot_cpu/(total_frames*0.01) : 0.0),
	       (timers->utt_timer.t_tot_cpu > 0 ? timers->utt_timer.t_tot_elapsed / timers->utt_timer.t_tot_cpu : 0.0));
    }    
    printf("\n");
    fflush(stdout);

    no_retries=0;
    /* dump the accumulators to a file system */
    while (cmd_ln_str("-accumdir") != NULL &&
	   accum_dump(cmd_ln_str("-accumdir"), inv,
		      mixw_reest,
		      tmat_reest,
		      mean_reest,
		      var_reest,
		      pass2var,
		      var_is_full,
		      FALSE) != S3_SUCCESS) {
	static int notified = FALSE;
	time_t t;
	char time_str[64];

	/*
	 * If we were not able to dump the parameters, write one log entry
	 * about the failure
	 */
	if (notified == FALSE) {
	    t = time(NULL);
	    strcpy(time_str, (const char *)ctime((const time_t *)&t));
	    /* nuke the newline at the end of this. */
	    time_str[strlen(time_str)-1] = '\0';
	    E_WARN("Count dump failed on %s.  Retrying dump every %3.1f hour until success.\n",
		   time_str, DUMP_RETRY_PERIOD/3600.0);

	    notified = TRUE;
	    no_retries++;
	    if(no_retries>10){ 
	      E_FATAL("Failed to get the files after 10 retries(about 5 minutes).\n ");
	    }
	}
	
	sleep(DUMP_RETRY_PERIOD);


    }

    if (profile) {
	ckd_free(timers);
    }

    /* Write a log entry on success */
    if (cmd_ln_str("-accumdir"))
	E_INFO("Counts saved to %s\n", cmd_ln_str("-accumdir"));
    else
	E_INFO("Counts NOT saved.\n");
}